

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

int SearchVocab(char *word)

{
  int iVar1;
  uint local_1c;
  uint hash;
  char *word_local;
  
  local_1c = GetWordHash(word);
  while( true ) {
    if (vocab_hash[local_1c] == -1) {
      return -1;
    }
    iVar1 = strcmp(word,vocab[vocab_hash[local_1c]].word);
    if (iVar1 == 0) break;
    local_1c = (local_1c + 1) % 30000000;
  }
  return vocab_hash[local_1c];
}

Assistant:

int SearchVocab(char *word) {
  unsigned int hash = GetWordHash(word);
  while (1) {
    if (vocab_hash[hash] == -1) return -1;
    if (!strcmp(word, vocab[vocab_hash[hash]].word)) return vocab_hash[hash];
    hash = (hash + 1) % vocab_hash_size;
  }
  return -1;
}